

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

avector<Vec3ff> *
embree::bezier_to_bspline_helper
          (avector<Vec3ff> *__return_storage_ptr__,
          vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          *indices,avector<Vec3ff> *positions)

{
  Vec3fx *pVVar1;
  Vec3fx *pVVar2;
  pointer pHVar3;
  pointer pHVar4;
  Vec3fx *pVVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  size_t i;
  Vec3fx *pVVar21;
  ulong uVar22;
  ulong uVar23;
  size_t *psVar24;
  long lVar25;
  size_t sVar26;
  
  psVar24 = &__return_storage_ptr__->size_active;
  __return_storage_ptr__->items = (Vec3fx *)0x0;
  __return_storage_ptr__->size_active = 0;
  __return_storage_ptr__->size_alloced = 0;
  pHVar3 = (indices->
           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pHVar4 = (indices->
           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar26 = (long)pHVar3 - (long)pHVar4 >> 1;
  lVar25 = (long)pHVar3 - (long)pHVar4;
  if (lVar25 == 0) {
    pVVar21 = (Vec3fx *)0x0;
  }
  else {
    pVVar21 = (Vec3fx *)alignedMalloc(lVar25 * 8,0x10);
    __return_storage_ptr__->items = pVVar21;
    alignedFree((void *)0x0);
    *psVar24 = sVar26;
    psVar24 = &__return_storage_ptr__->size_alloced;
  }
  *psVar24 = sVar26;
  pVVar21 = pVVar21 + 3;
  for (uVar22 = 0;
      pHVar3 = (indices->
               super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar22 < (ulong)((long)(indices->
                             super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3);
      uVar22 = uVar22 + 1) {
    uVar23 = (ulong)pHVar3[uVar22].vertex;
    pVVar5 = positions->items;
    pVVar1 = pVVar5 + uVar23;
    fVar6 = (pVVar1->field_0).m128[1];
    fVar7 = (pVVar1->field_0).m128[2];
    fVar8 = (pVVar1->field_0).m128[3];
    pVVar2 = pVVar5 + uVar23 + 1;
    fVar9 = (pVVar2->field_0).m128[0];
    fVar10 = (pVVar2->field_0).m128[1];
    fVar11 = (pVVar2->field_0).m128[2];
    fVar12 = (pVVar2->field_0).m128[3];
    pVVar2 = pVVar5 + uVar23 + 2;
    fVar13 = (pVVar2->field_0).m128[0];
    fVar14 = (pVVar2->field_0).m128[1];
    fVar15 = (pVVar2->field_0).m128[2];
    fVar16 = (pVVar2->field_0).m128[3];
    pVVar5 = pVVar5 + uVar23 + 3;
    fVar17 = (pVVar5->field_0).m128[0];
    fVar18 = (pVVar5->field_0).m128[1];
    fVar19 = (pVVar5->field_0).m128[2];
    fVar20 = (pVVar5->field_0).m128[3];
    pVVar21[-3].field_0.m128[0] = ((pVVar1->field_0).m128[0] * 6.0 - fVar9 * 7.0) + fVar13 + fVar13;
    pVVar21[-3].field_0.m128[1] = (fVar6 * 6.0 - fVar10 * 7.0) + fVar14 + fVar14;
    pVVar21[-3].field_0.m128[2] = (fVar7 * 6.0 - fVar11 * 7.0) + fVar15 + fVar15;
    pVVar21[-3].field_0.m128[3] = (fVar8 * 6.0 - fVar12 * 7.0) + fVar16 + fVar16;
    pVVar21[-2].field_0.m128[0] = (fVar9 + fVar9) - fVar13;
    pVVar21[-2].field_0.m128[1] = (fVar10 + fVar10) - fVar14;
    pVVar21[-2].field_0.m128[2] = (fVar11 + fVar11) - fVar15;
    pVVar21[-2].field_0.m128[3] = (fVar12 + fVar12) - fVar16;
    pVVar21[-1].field_0.m128[0] = (fVar13 + fVar13) - fVar9;
    pVVar21[-1].field_0.m128[1] = (fVar14 + fVar14) - fVar10;
    pVVar21[-1].field_0.m128[2] = (fVar15 + fVar15) - fVar11;
    pVVar21[-1].field_0.m128[3] = (fVar16 + fVar16) - fVar12;
    (pVVar21->field_0).m128[0] = fVar17 * 6.0 + ((fVar9 + fVar9) - fVar13 * 7.0);
    (pVVar21->field_0).m128[1] = fVar18 * 6.0 + ((fVar10 + fVar10) - fVar14 * 7.0);
    (pVVar21->field_0).m128[2] = fVar19 * 6.0 + ((fVar11 + fVar11) - fVar15 * 7.0);
    (pVVar21->field_0).m128[3] = fVar20 * 6.0 + ((fVar12 + fVar12) - fVar16 * 7.0);
    pVVar21 = pVVar21 + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

avector<Vec3ff> bezier_to_bspline_helper(const std::vector<SceneGraph::HairSetNode::Hair>& indices, const avector<Vec3ff>& positions)
  {
    avector<Vec3ff> positions_o;
    positions_o.resize(4*indices.size());
    for (size_t i=0; i<indices.size(); i++) 
    {
      const size_t idx = indices[i].vertex;
      vfloat4 v0 = vfloat4::loadu(&positions[idx+0]);  
      vfloat4 v1 = vfloat4::loadu(&positions[idx+1]);
      vfloat4 v2 = vfloat4::loadu(&positions[idx+2]);
      vfloat4 v3 = vfloat4::loadu(&positions[idx+3]);
      positions_o[4*i+0] = Vec3ff( 6.0f*v0 - 7.0f*v1 + 2.0f*v2);
      positions_o[4*i+1] = Vec3ff( 2.0f*v1 - 1.0f*v2);
      positions_o[4*i+2] = Vec3ff(-1.0f*v1 + 2.0f*v2);
      positions_o[4*i+3] = Vec3ff( 2.0f*v1 - 7.0f*v2 + 6.0f*v3);
    }
    return positions_o;
  }